

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_MAC_Poly1305.c
# Opt level: O2

void Hacl_MAC_Poly1305_reset(Hacl_MAC_Poly1305_state_t *state,uint8_t *key)

{
  uint64_t *ctx;
  uint8_t *puVar1;
  uint8_t *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  
  ctx = state->block_state;
  puVar1 = state->buf;
  puVar2 = state->p_key;
  Hacl_MAC_Poly1305_poly1305_init(ctx,key);
  uVar3 = *(undefined8 *)key;
  uVar4 = *(undefined8 *)(key + 8);
  uVar5 = *(undefined8 *)(key + 0x18);
  *(undefined8 *)(puVar2 + 0x10) = *(undefined8 *)(key + 0x10);
  *(undefined8 *)(puVar2 + 0x18) = uVar5;
  *(undefined8 *)puVar2 = uVar3;
  *(undefined8 *)(puVar2 + 8) = uVar4;
  state->block_state = ctx;
  state->buf = puVar1;
  state->total_len = 0;
  state->p_key = puVar2;
  return;
}

Assistant:

void Hacl_MAC_Poly1305_reset(Hacl_MAC_Poly1305_state_t *state, uint8_t *key)
{
  Hacl_MAC_Poly1305_state_t scrut = *state;
  uint8_t *k_ = scrut.p_key;
  uint8_t *buf = scrut.buf;
  uint64_t *block_state = scrut.block_state;
  Hacl_MAC_Poly1305_poly1305_init(block_state, key);
  memcpy(k_, key, 32U * sizeof (uint8_t));
  uint8_t *k_1 = k_;
  Hacl_MAC_Poly1305_state_t
  tmp = { .block_state = block_state, .buf = buf, .total_len = (uint64_t)0U, .p_key = k_1 };
  state[0U] = tmp;
}